

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

void json_append_data(lua_State *l,json_config_t *cfg,int current_depth,strbuf_t *json)

{
  int iVar1;
  int array_length;
  void *pvVar2;
  int len;
  strbuf_t *json_local;
  int current_depth_local;
  json_config_t *cfg_local;
  lua_State *l_local;
  
  iVar1 = lua_type(l,-1);
  switch(iVar1) {
  case 0:
    strbuf_append_mem(json,"null",4);
    break;
  case 1:
    iVar1 = lua_toboolean(l,-1);
    if (iVar1 == 0) {
      strbuf_append_mem(json,"false",5);
    }
    else {
      strbuf_append_mem(json,"true",4);
    }
    break;
  case 2:
    pvVar2 = lua_touserdata(l,-1);
    if (pvVar2 == (void *)0x0) {
      strbuf_append_mem(json,"null",4);
      return;
    }
  default:
    json_encode_exception(l,cfg,json,-1,"type not supported");
    break;
  case 3:
    json_append_number(l,cfg,json,-1);
    break;
  case 4:
    json_append_string(l,json,-1);
    break;
  case 5:
    iVar1 = current_depth + 1;
    json_check_encode_depth(l,cfg,iVar1,json);
    array_length = lua_array_length(l,cfg,json);
    if (array_length < 1) {
      json_append_object(l,cfg,iVar1,json);
    }
    else {
      json_append_array(l,cfg,iVar1,json,array_length);
    }
  }
  return;
}

Assistant:

static void json_append_data(lua_State *l, json_config_t *cfg,
                             int current_depth, strbuf_t *json)
{
    int len;

    switch (lua_type(l, -1)) {
    case LUA_TSTRING:
        json_append_string(l, json, -1);
        break;
    case LUA_TNUMBER:
        json_append_number(l, cfg, json, -1);
        break;
    case LUA_TBOOLEAN:
        if (lua_toboolean(l, -1))
            strbuf_append_mem(json, "true", 4);
        else
            strbuf_append_mem(json, "false", 5);
        break;
    case LUA_TTABLE:
        current_depth++;
        json_check_encode_depth(l, cfg, current_depth, json);
        len = lua_array_length(l, cfg, json);
        if (len > 0)
            json_append_array(l, cfg, current_depth, json, len);
        else
            json_append_object(l, cfg, current_depth, json);
        break;
    case LUA_TNIL:
        strbuf_append_mem(json, "null", 4);
        break;
    case LUA_TLIGHTUSERDATA:
        if (lua_touserdata(l, -1) == NULL) {
            strbuf_append_mem(json, "null", 4);
            break;
        }
    default:
        /* Remaining types (LUA_TFUNCTION, LUA_TUSERDATA, LUA_TTHREAD,
         * and LUA_TLIGHTUSERDATA) cannot be serialised */
        json_encode_exception(l, cfg, json, -1, "type not supported");
        /* never returns */
    }
}